

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

void poplocal(void)

{
  Item *pIVar1;
  Item *j;
  Item *i;
  List *sl;
  Item *local_10;
  
  if (symlistlist->next != symlistlist) {
    pIVar1 = (symlistlist->next->element).itm;
    local_10 = pIVar1->next;
    while (local_10 != pIVar1) {
      local_10 = local_10->next;
      delete((Item *)0x11aa80);
    }
    delete((Item *)0x11aa9d);
    return;
  }
  __assert_fail("symlistlist->next != symlistlist",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/symbol.c"
                ,0x81,"void poplocal()");
}

Assistant:

void poplocal() /* a lot of storage leakage here for symbols we are guaranteed
	not to need */
{
	List *sl;
	Item *i, *j;

	assert(symlistlist->next != symlistlist);
	sl = LST(symlistlist->next);
	for (i = sl->next; i != sl; i = j) {
		j = i->next;
		delete(i);
	}
	delete(symlistlist->next);
}